

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.h
# Opt level: O0

void init_interp_filter_params
               (InterpFilterParams **interp_filter_params,InterpFilters *filter,int block_width,
               int block_height,int is_intrabc)

{
  InterpFilterParams *pIVar1;
  int in_ECX;
  int in_EDX;
  undefined2 *in_RSI;
  undefined8 *in_RDI;
  int in_R8D;
  
  if (in_R8D == 0) {
    pIVar1 = av1_get_interp_filter_params_with_block_size((InterpFilter)in_RSI[1],in_EDX);
    *in_RDI = pIVar1;
    pIVar1 = av1_get_interp_filter_params_with_block_size((InterpFilter)*in_RSI,in_ECX);
    in_RDI[1] = pIVar1;
  }
  else {
    *in_RDI = &av1_intrabc_filter_params;
    in_RDI[1] = &av1_intrabc_filter_params;
  }
  return;
}

Assistant:

static inline void init_interp_filter_params(
    const InterpFilterParams *interp_filter_params[2],
    const InterpFilters *filter, int block_width, int block_height,
    int is_intrabc) {
  if (UNLIKELY(is_intrabc)) {
    interp_filter_params[0] = &av1_intrabc_filter_params;
    interp_filter_params[1] = &av1_intrabc_filter_params;
  } else {
    interp_filter_params[0] = av1_get_interp_filter_params_with_block_size(
        (InterpFilter)filter->x_filter, block_width);
    interp_filter_params[1] = av1_get_interp_filter_params_with_block_size(
        (InterpFilter)filter->y_filter, block_height);
  }
}